

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_0::CWriter::WriteCHeader(CWriter *this)

{
  SymbolSet *pSVar1;
  SymbolMap *set;
  pointer *pppIVar2;
  _Rb_tree_header *p_Var3;
  string *__rhs;
  char cVar4;
  ExternalKind EVar5;
  Export *pEVar6;
  size_type sVar7;
  pointer pcVar8;
  pointer ppIVar9;
  Export **ppEVar10;
  iterator __position;
  Import *pIVar11;
  CWriter *this_00;
  Import *pIVar12;
  Global *pGVar13;
  pointer ppMVar14;
  Memory *pMVar15;
  pointer ppTVar16;
  Table *pTVar17;
  pointer ppDVar18;
  DataSegment *pDVar19;
  pointer ppEVar20;
  ElemSegment *pEVar21;
  pointer ppTVar22;
  TypeEntry *pTVar23;
  bool bVar24;
  uint uVar25;
  size_t sVar26;
  undefined8 uVar27;
  _Rb_tree_node_base *p_Var28;
  undefined8 *puVar29;
  Module *pMVar30;
  Newline *pNVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar33;
  Newline *u;
  pointer ppGVar34;
  pointer ppGVar35;
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *u_00;
  Newline *u_01;
  char *pcVar36;
  Newline *u_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_03;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  Newline *u_04;
  Newline *extraout_RDX_03;
  Newline *extraout_RDX_04;
  Newline *extraout_RDX_05;
  Newline *extraout_RDX_06;
  Newline *extraout_RDX_07;
  Newline *extraout_RDX_08;
  Newline *extraout_RDX_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_05;
  Newline *extraout_RDX_10;
  Newline *extraout_RDX_11;
  Newline *extraout_RDX_12;
  Newline *extraout_RDX_13;
  Newline *extraout_RDX_14;
  Newline *extraout_RDX_15;
  Newline *extraout_RDX_16;
  Newline *extraout_RDX_17;
  Newline *extraout_RDX_18;
  Newline *extraout_RDX_19;
  Newline *extraout_RDX_20;
  Newline *extraout_RDX_21;
  Newline *extraout_RDX_22;
  Newline *extraout_RDX_23;
  Newline *extraout_RDX_24;
  Newline *extraout_RDX_25;
  Newline *extraout_RDX_26;
  Newline *extraout_RDX_27;
  Newline *extraout_RDX_28;
  Newline *extraout_RDX_29;
  Newline *extraout_RDX_30;
  Newline *extraout_RDX_31;
  Newline *extraout_RDX_32;
  Newline *u_06;
  int __c;
  pointer ppIVar37;
  pointer ppDVar38;
  pointer ppEVar39;
  CWriter *pCVar40;
  pointer ppIVar41;
  char *pcVar42;
  long lVar43;
  undefined8 in_R8;
  ulong uVar44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_R9;
  const_iterator __begin3;
  pointer ppIVar45;
  pointer ppGVar46;
  pointer ppMVar47;
  pointer ppTVar48;
  size_type sVar49;
  long lVar50;
  __normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
  __it;
  pointer ppTVar51;
  pointer ppIVar52;
  __normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
  _Var53;
  string_view export_name;
  string_view module_name;
  string_view module_name_00;
  string_view module_name_01;
  string_view module_name_02;
  string_view module_name_03;
  string_view module_name_04;
  string_view str;
  string_view str_00;
  string_view module_name_05;
  string_view module_name_06;
  string_view module_name_07;
  string_view module_name_08;
  string_view str_01;
  string_view str_02;
  string_view module_name_09;
  string_view module_name_10;
  string_view str_03;
  string_view str_04;
  string_view module_name_11;
  string_view wasm_name;
  string_view export_name_00;
  string_view wasm_name_00;
  string_view export_name_01;
  string_view wasm_name_01;
  string_view export_name_02;
  string_view export_name_03;
  string_view export_name_04;
  string_view export_name_05;
  string_view export_name_06;
  string_view export_name_07;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>_>,_bool>
  pVar54;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar55;
  undefined1 auVar56 [16];
  string_view proposed_name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string name;
  Import *import;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>_>_>
  import_map;
  string guard;
  CWriter *pCVar57;
  CWriter *pCVar58;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_t local_80;
  SymbolMap *local_78;
  CWriter *local_70;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_68;
  pointer local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (this->module_->exports).
            super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (this->module_->exports).
             super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (pbVar33 != local_d0) {
    pSVar1 = &this->global_syms_;
    set = &this->global_sym_map_;
    do {
      pEVar6 = (Export *)(pbVar33->_M_dataplus)._M_p;
      in_R8 = (pEVar6->name)._M_dataplus._M_p;
      sVar7 = (pEVar6->name)._M_string_length;
      export_name._M_str = (char *)in_R8;
      export_name._M_len = sVar7;
      (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                ((string *)&stack0xfffffffffffffed0,(CWriter *)this,export_name);
      wasm_name._M_str = (char *)&stack0xfffffffffffffed0;
      wasm_name._M_len = in_R8;
      in_R9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&stack0xfffffffffffffed0;
      ClaimName((CWriter *)pSVar1,(SymbolSet *)set,(SymbolMap *)0x64,(char)sVar7,wasm_name,
                (string *)this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffed0 != &local_120) {
        operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
      }
      pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &pbVar33->_M_string_length;
    } while (pbVar33 != local_d0);
  }
  this->stream_ = this->h_stream_;
  pcVar8 = (this->header_name_)._M_dataplus._M_p;
  sVar7 = (this->header_name_)._M_string_length;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pCVar40 = this;
  if (sVar7 != 0) {
    sVar49 = 0;
    do {
      __c = (int)pcVar8[sVar49];
      uVar25 = isalnum(__c);
      if ((__c == 0x5f) || (this = (CWriter *)(ulong)uVar25, uVar25 != 0)) {
        toupper(__c);
      }
      std::__cxx11::string::push_back((char)&local_50);
      sVar49 = sVar49 + 1;
    } while (sVar7 != sVar49);
  }
  pcVar42 = "_GENERATED_";
  std::__cxx11::string::append((char *)&local_50);
  pCVar57 = pCVar40;
  (anonymous_namespace)::CWriter::Write<char_const(&)[40],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)pCVar40,(char (*) [40])pcVar42,u);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[9],std::__cxx11::string&,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)pCVar40,(char (*) [9])"#ifndef ",&local_50,(Newline *)this);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[9],std::__cxx11::string&,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)pCVar40,(char (*) [9])"#define ",&local_50,(Newline *)this);
  if (pCVar40->consecutive_newline_count_ < 2) {
    WriteData(pCVar40,"\n",1);
    pCVar40->consecutive_newline_count_ = pCVar40->consecutive_newline_count_ + 1;
  }
  pCVar40->should_write_indent_next_ = true;
  pMVar30 = pCVar40->module_;
  if ((pMVar30->features_used).simd != true) {
    pNVar31 = (Newline *)0x0;
    goto LAB_0013bf3c;
  }
  pNVar31 = (Newline *)0xfffffffb;
  ppGVar35 = (pMVar30->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar46 = (pMVar30->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  uVar44 = (long)ppGVar46 - (long)ppGVar35;
  if (0 < (long)uVar44 >> 5) {
    ppGVar34 = (pointer)((uVar44 & 0xffffffffffffffe0) + (long)ppGVar35);
    lVar43 = ((long)uVar44 >> 5) + 1;
    ppGVar35 = ppGVar35 + 2;
    do {
      in_R8 = ppGVar35[-2];
      if (((_Base_ptr)(in_R8 + 0x20))->_M_color == 0xfffffffb) {
        ppGVar35 = ppGVar35 + -2;
        goto LAB_0013bce9;
      }
      in_R8 = ppGVar35[-1];
      if (((_Base_ptr)(in_R8 + 0x20))->_M_color == 0xfffffffb) {
        ppGVar35 = ppGVar35 + -1;
        goto LAB_0013bce9;
      }
      in_R8 = *ppGVar35;
      if (((_Base_ptr)(in_R8 + 0x20))->_M_color == 0xfffffffb) goto LAB_0013bce9;
      in_R8 = ppGVar35[1];
      if (((_Base_ptr)(in_R8 + 0x20))->_M_color == 0xfffffffb) {
        ppGVar35 = ppGVar35 + 1;
        goto LAB_0013bce9;
      }
      lVar43 = lVar43 + -1;
      ppGVar35 = ppGVar35 + 4;
    } while (1 < lVar43);
    uVar44 = (long)ppGVar46 - (long)ppGVar34;
    ppGVar35 = ppGVar34;
  }
  in_R8 = (long)uVar44 >> 3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_R8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x1) {
LAB_0013bcca:
    if (((*ppGVar35)->type).enum_ != V128) {
      ppGVar35 = ppGVar46;
    }
LAB_0013bce9:
    pNVar31 = (Newline *)0xffffff01;
    if (ppGVar35 != ppGVar46) goto LAB_0013bf3c;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_R8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x2) {
LAB_0013bcbe:
      if (((*ppGVar35)->type).enum_ != V128) {
        ppGVar35 = ppGVar35 + 1;
        goto LAB_0013bcca;
      }
      goto LAB_0013bce9;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_R8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x3) {
      if (((*ppGVar35)->type).enum_ != V128) {
        ppGVar35 = ppGVar35 + 1;
        goto LAB_0013bcbe;
      }
      goto LAB_0013bce9;
    }
  }
  ppIVar45 = (pMVar30->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppIVar9 = (pMVar30->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar44 = (long)ppIVar9 - (long)ppIVar45;
  if (0 < (long)uVar44 >> 5) {
    ppIVar52 = (pointer)((uVar44 & 0xffffffffffffffe0) + (long)ppIVar45);
    lVar43 = ((long)uVar44 >> 5) + 1;
    ppIVar45 = ppIVar45 + 2;
    do {
      if ((ppIVar45[-2]->kind_ == First) &&
         (bVar24 = func_uses_simd((FuncSignature *)((long)&ppIVar45[-2][2].module_name.field_2 + 8))
         , bVar24)) {
        ppIVar45 = ppIVar45 + -2;
        goto LAB_0013be3e;
      }
      if ((ppIVar45[-1]->kind_ == First) &&
         (bVar24 = func_uses_simd((FuncSignature *)((long)&ppIVar45[-1][2].module_name.field_2 + 8))
         , bVar24)) {
        ppIVar45 = ppIVar45 + -1;
        goto LAB_0013be3e;
      }
      if (((*ppIVar45)->kind_ == First) &&
         (bVar24 = func_uses_simd((FuncSignature *)((long)&(*ppIVar45)[2].module_name.field_2 + 8)),
         bVar24)) goto LAB_0013be3e;
      if ((ppIVar45[1]->kind_ == First) &&
         (bVar24 = func_uses_simd((FuncSignature *)((long)&ppIVar45[1][2].module_name.field_2 + 8)),
         bVar24)) {
        ppIVar45 = ppIVar45 + 1;
        goto LAB_0013be3e;
      }
      lVar43 = lVar43 + -1;
      ppIVar45 = ppIVar45 + 4;
    } while (1 < lVar43);
    uVar44 = (long)ppIVar9 - (long)ppIVar52;
    ppIVar45 = ppIVar52;
  }
  lVar43 = (long)uVar44 >> 3;
  if (lVar43 == 1) {
LAB_0013be10:
    if (((*ppIVar45)->kind_ == First) &&
       (bVar24 = func_uses_simd((FuncSignature *)((long)&(*ppIVar45)[2].module_name.field_2 + 8)),
       bVar24)) goto LAB_0013be3e;
  }
  else {
    if (lVar43 == 2) {
LAB_0013bdf3:
      if (((*ppIVar45)->kind_ != First) ||
         (bVar24 = func_uses_simd((FuncSignature *)((long)&(*ppIVar45)[2].module_name.field_2 + 8)),
         !bVar24)) {
        ppIVar45 = ppIVar45 + 1;
        goto LAB_0013be10;
      }
    }
    else {
      if (lVar43 != 3) goto LAB_0013be49;
      if (((*ppIVar45)->kind_ != First) ||
         (bVar24 = func_uses_simd((FuncSignature *)((long)&(*ppIVar45)[2].module_name.field_2 + 8)),
         !bVar24)) {
        ppIVar45 = ppIVar45 + 1;
        goto LAB_0013bdf3;
      }
    }
LAB_0013be3e:
    pNVar31 = (Newline *)CONCAT71((int7)((ulong)pNVar31 >> 8),1);
    if (ppIVar45 != ppIVar9) goto LAB_0013bf3c;
  }
LAB_0013be49:
  __it._M_current =
       (pMVar30->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  ppEVar10 = (pMVar30->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  lVar43 = (long)ppEVar10 - (long)__it._M_current;
  pCVar40 = pCVar57;
  if (0 < lVar43 >> 5) {
    lVar50 = (lVar43 >> 5) + 1;
    do {
      pCVar57 = pCVar40;
      bVar24 = __gnu_cxx::__ops::
               _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::operator()
                         ((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2>
                           *)pCVar40,__it);
      _Var53._M_current = __it._M_current;
      if (bVar24) goto LAB_0013bf36;
      bVar24 = __gnu_cxx::__ops::
               _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::operator()
                         ((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2>
                           *)pCVar40,
                          (__normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                           )(__it._M_current + 1));
      _Var53._M_current = __it._M_current + 1;
      if (bVar24) goto LAB_0013bf36;
      bVar24 = __gnu_cxx::__ops::
               _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::operator()
                         ((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2>
                           *)pCVar40,
                          (__normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                           )(__it._M_current + 2));
      _Var53._M_current = __it._M_current + 2;
      if (bVar24) goto LAB_0013bf36;
      bVar24 = __gnu_cxx::__ops::
               _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::operator()
                         ((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2>
                           *)pCVar40,
                          (__normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                           )(__it._M_current + 3));
      _Var53._M_current = __it._M_current + 3;
      if (bVar24) goto LAB_0013bf36;
      __it._M_current = __it._M_current + 4;
      lVar50 = lVar50 + -1;
      lVar43 = lVar43 + -0x20;
      pCVar40 = pCVar57;
    } while (1 < lVar50);
  }
  lVar43 = lVar43 >> 3;
  pCVar57 = pCVar40;
  if (lVar43 == 1) {
LAB_0013bf22:
    bVar24 = __gnu_cxx::__ops::
             _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::operator()
                       ((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2> *
                        )pCVar40,__it);
    _Var53._M_current = __it._M_current;
    if (!bVar24) {
      _Var53._M_current = ppEVar10;
    }
  }
  else if (lVar43 == 2) {
LAB_0013bf0f:
    bVar24 = __gnu_cxx::__ops::
             _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::operator()
                       ((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2> *
                        )pCVar40,__it);
    _Var53._M_current = __it._M_current;
    if (!bVar24) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0013bf22;
    }
  }
  else {
    _Var53._M_current = ppEVar10;
    if ((lVar43 == 3) &&
       (bVar24 = __gnu_cxx::__ops::
                 _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::
                 operator()((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2>
                             *)pCVar40,__it), _Var53._M_current = __it._M_current, !bVar24)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0013bf0f;
    }
  }
LAB_0013bf36:
  pNVar31 = (Newline *)CONCAT71((int7)((ulong)pNVar31 >> 8),_Var53._M_current != ppEVar10);
LAB_0013bf3c:
  pCVar57->simd_used_in_header_ = SUB81(pNVar31,0);
  pCVar40 = pCVar57;
  WriteData(pCVar57,"#include \"wasm-rt.h\"",0x14);
  u_00 = extraout_RDX;
  if (pCVar57->consecutive_newline_count_ < 2) {
    WriteData(pCVar57,"\n",1);
    pCVar57->consecutive_newline_count_ = pCVar57->consecutive_newline_count_ + 1;
    u_00 = extraout_RDX_00;
  }
  pCVar57->should_write_indent_next_ = true;
  if ((pCVar57->module_->features_used).exceptions == true) {
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[32],wabt::(anonymous_namespace)::Newline,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)pCVar57,(char (*) [32])"#include \"wasm-rt-exceptions.h\"",u_00,pNVar31);
  }
  if (pCVar57->simd_used_in_header_ == true) {
    WriteV128Decl(pCVar57);
  }
  if (pCVar57->consecutive_newline_count_ < 2) {
    WriteData(pCVar57,"\n",1);
    pCVar57->consecutive_newline_count_ = pCVar57->consecutive_newline_count_ + 1;
  }
  pCVar57->should_write_indent_next_ = true;
  pcVar42 = s_header_top;
  sVar26 = strlen(s_header_top);
  WriteData(pCVar57,pcVar42,sVar26);
  if (pCVar57->consecutive_newline_count_ < 2) {
    WriteData(pCVar57,"\n",1);
    pCVar57->consecutive_newline_count_ = pCVar57->consecutive_newline_count_ + 1;
  }
  pCVar57->should_write_indent_next_ = true;
  ppIVar45 = (pCVar57->module_->imports).
             super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppIVar9 = (pCVar57->module_->imports).
            super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar45 == ppIVar9) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffed0,"w2c_",&pCVar57->module_prefix_);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[16],std::__cxx11::string,char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)pCVar57,(char (*) [16])&stack0xfffffffffffffed0,u_05,(char (*) [2])pNVar31
               ,(OpenBrace *)in_R8);
    pNVar31 = extraout_RDX_10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffed0 != &local_120) {
      operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
      pNVar31 = extraout_RDX_11;
    }
  }
  else {
    paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_a8 + 8);
    local_a8._8_4_ = _S_red;
    local_98._M_allocated_capacity = 0;
    local_80 = 0;
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pCVar57->import_func_module_set_;
    local_98._8_8_ = paVar32;
    local_88 = paVar32;
    do {
      local_f0._0_8_ = *ppIVar45;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffed0,&((Import *)local_f0._0_8_)->module_name,
                 &((Import *)local_f0._0_8_)->field_name);
      pVar54 = std::
               _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,wabt::Import_const*>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,wabt::Import_const*>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,wabt::Import_const*>>>
               ::
               _M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>,wabt::Import_const*&>
                         ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,wabt::Import_const*>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,wabt::Import_const*>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,wabt::Import_const*>>>
                           *)local_a8,
                          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&stack0xfffffffffffffed0,(Import **)local_f0);
      pCVar58 = pCVar40;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != &local_100) {
        operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
        pCVar58 = pCVar40;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffed0 != &local_120) {
        operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
      }
      pCVar40 = pCVar58;
      if (((undefined1  [16])pVar54 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (*(ExternalKind *)(*(long *)(pVar54.first._M_node._M_node + 3) + 0x48) !=
            *(ExternalKind *)(local_f0._0_8_ + 0x48)) {
          printf("unimplemented: %s\n","contradictory import declaration");
          abort();
        }
        _GLOBAL__N_1::CWriter::WriteCHeader((CWriter *)local_f0._0_8_);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&pCVar57->import_module_set_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_f0._0_8_ + 8));
      if (*(ExternalKind *)(local_f0._0_8_ + 0x48) == First) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f0._0_8_ + 8));
      }
      ppIVar45 = ppIVar45 + 1;
    } while (ppIVar45 != ppIVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_a8 + 8)) {
      uVar27 = local_98._8_8_;
      do {
        __position._M_current =
             (pCVar58->unique_imports_).
             super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pCVar58->unique_imports_).
            super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::Import_const*,std::allocator<wabt::Import_const*>>::
          _M_realloc_insert<wabt::Import_const*const&>
                    ((vector<wabt::Import_const*,std::allocator<wabt::Import_const*>> *)
                     &pCVar58->unique_imports_,__position,
                     (Import **)
                     &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(uVar27 + 0x60))->_M_allocated_capacity);
        }
        else {
          *__position._M_current =
               (Import *)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(uVar27 + 0x60))->_M_allocated_capacity;
          pppIVar2 = &(pCVar58->unique_imports_).
                      super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar2 = *pppIVar2 + 1;
        }
        uVar27 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar27);
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)uVar27 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_a8 + 8));
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>_>_>
    ::_M_erase((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>_>_>
                *)local_a8,(_Link_type)local_98._M_allocated_capacity);
    ppIVar45 = (pCVar58->module_->imports).
               super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_60 = (pCVar58->module_->imports).
               super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppIVar45 != local_60) {
      local_68 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&pCVar40->import_module_sym_map_;
      local_70 = (CWriter *)&pCVar40->global_syms_;
      local_78 = &pCVar40->global_sym_map_;
      do {
        pIVar11 = *ppIVar45;
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pIVar11->module_name)._M_dataplus._M_p;
        this_00 = (CWriter *)(pIVar11->module_name)._M_string_length;
        local_58 = (pIVar11->field_name)._M_dataplus._M_p;
        pcVar42 = (char *)(pIVar11->field_name)._M_string_length;
        in_R8 = &local_120;
        local_128 = (SymbolSet *)0x0;
        local_120._M_allocated_capacity = local_120._M_allocated_capacity & 0xffffffffffffff00;
        uVar44 = 0x61;
        paVar32 = in_R9;
        if (pIVar11->kind_ < (Last|Table)) {
          uVar44 = 0x6b62686661 >> ((byte)(pIVar11->kind_ << 3) & 0x3f);
          std::__cxx11::string::_M_assign((string *)&stack0xfffffffffffffed0);
          paVar32 = in_R9;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::__cxx11::string&,std::__cxx11::string_const&>
                  (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &stack0xfffffffffffffed0,&pIVar11->module_name);
        in_R9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8;
        module_name._M_str = pcVar42;
        module_name._M_len = (size_t)local_d0;
        export_name_00._M_str = (char *)paVar32;
        export_name_00._M_len = (size_t)local_58;
        (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                  ((string *)in_R9,this_00,module_name,export_name_00);
        pCVar57 = local_70;
        pVar55 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_70,(key_type *)in_R9);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)pCVar57,(_Base_ptr)pVar55.first._M_node,(_Base_ptr)pVar55.second._M_node);
        paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        wasm_name_00._M_str = (char *)in_R9;
        wasm_name_00._M_len = in_R8;
        in_stack_fffffffffffffed0 = in_R8;
        ClaimName(pCVar57,(SymbolSet *)local_78,(SymbolMap *)(uVar44 & 0xff),'\0',wasm_name_00,
                  (string *)pCVar40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._0_8_ != &local_98) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0 != &local_120) {
          operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
        }
        ppIVar45 = ppIVar45 + 1;
      } while (ppIVar45 != local_60);
    }
    p_Var28 = (pCVar40->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(pCVar40->import_module_set_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var28 != p_Var3) {
      pSVar1 = &pCVar40->global_syms_;
      local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &pCVar40->global_sym_map_;
      do {
        in_R8 = *(undefined8 *)(p_Var28 + 1);
        paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)p_Var28[1]._M_parent;
        module_name_00._M_str = (char *)0x8;
        module_name_00._M_len = in_R8;
        export_name_01._M_str = (char *)in_R9;
        export_name_01._M_len = (size_t)"instance";
        pcVar42 = "instance";
        (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                  ((string *)&stack0xfffffffffffffed0,(CWriter *)paVar32->_M_local_buf,
                   module_name_00,export_name_01);
        proposed_name._M_str = pcVar42;
        proposed_name._M_len = in_stack_fffffffffffffed0;
        FindUniqueName((string *)local_a8,(CWriter *)pSVar1,(SymbolSet *)local_128,proposed_name);
        wasm_name_01._M_str = (char *)local_a8;
        wasm_name_01._M_len = in_R8;
        in_R9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8;
        ClaimName((CWriter *)pSVar1,(SymbolSet *)local_d0,(SymbolMap *)0x63,(char)paVar32,
                  wasm_name_01,(string *)pCVar40);
        pCVar57 = pCVar40;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0 != &local_120) {
          operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
          pCVar57 = pCVar40;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._0_8_ != &local_98) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
        }
        module_name_01._M_str = (char *)paVar32;
        module_name_01._M_len = *(size_t *)(p_Var28 + 1);
        (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                  ((string *)&stack0xfffffffffffffed0,(CWriter *)p_Var28[1]._M_parent,module_name_01
                  );
        pCVar40 = pCVar57;
        WriteData(pCVar57,"struct ",7);
        WriteData(pCVar57,(char *)in_stack_fffffffffffffed0,local_128);
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)pCVar57,(char (*) [2])0x16ea3a,u_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0 != &local_120) {
          operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
        }
        p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28);
      } while ((_Rb_tree_header *)p_Var28 != p_Var3);
    }
    ppIVar37 = (pCVar40->unique_imports_).
               super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar41 = (pCVar40->unique_imports_).
               super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar37 != ppIVar41) {
      do {
        pIVar11 = *ppIVar37;
        if ((pIVar11->kind_ & ~Last) != First) {
          WriteData(pCVar40,"extern ",7);
          EVar5 = pIVar11->kind_;
          pCVar57 = pCVar40;
          if (EVar5 == Table) {
            WriteTableType(pCVar40,(Type *)(ulong)*(uint *)&pIVar11[1].field_name.field_2);
          }
          else if (EVar5 == Memory) {
            cVar4 = *(char *)((long)&pIVar11[1].field_name._M_string_length + 1);
            pcVar42 = "wasm_rt_memory_t";
            if (cVar4 != '\0') {
              pcVar42 = "wasm_rt_shared_memory_t";
            }
            pcVar36 = pcVar42 + 0x10;
            if (cVar4 != '\0') {
              pcVar36 = pcVar42 + 0x17;
            }
            in_stack_fffffffffffffed0 = &local_120;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffffed0,pcVar42,pcVar36);
            WriteData(pCVar40,(char *)in_stack_fffffffffffffed0,local_128);
            pCVar57 = pCVar40;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)in_stack_fffffffffffffed0 != &local_120) {
              operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1)
              ;
              pCVar57 = pCVar40;
            }
          }
          else {
            if (EVar5 != Global) goto LAB_0013d8a0;
            Write(pCVar40,*(Type *)((long)&pIVar11[1].module_name.field_2 + 8));
          }
          in_R8 = (pIVar11->field_name)._M_dataplus._M_p;
          paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pIVar11->field_name)._M_string_length;
          module_name_02._M_str = (char *)paVar32;
          module_name_02._M_len = (size_t)(pIVar11->module_name)._M_dataplus._M_p;
          export_name_02._M_str = (char *)in_R9;
          export_name_02._M_len = in_R8;
          (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                    ((string *)&stack0xfffffffffffffed0,
                     (CWriter *)(pIVar11->module_name)._M_string_length,module_name_02,
                     export_name_02);
          module_name_03._M_str = (char *)paVar32;
          module_name_03._M_len = (size_t)(pIVar11->module_name)._M_dataplus._M_p;
          (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                    ((string *)local_f0,(CWriter *)(pIVar11->module_name)._M_string_length,
                     module_name_03);
          WriteData(pCVar40,"* ",2);
          WriteData(pCVar40,(char *)in_stack_fffffffffffffed0,local_128);
          WriteData(pCVar40,"(struct ",8);
          WriteData(pCVar40,(char *)local_f0._0_8_,local_f0._8_8_);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[4],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)pCVar40,(char (*) [4])"*);",u_02);
          pCVar40 = pCVar57;
          if ((Import *)local_f0._0_8_ != (Import *)(local_f0 + 0x10)) {
            operator_delete((void *)local_f0._0_8_,CONCAT62(local_f0._18_6_,local_f0._16_2_) + 1);
            pCVar40 = pCVar57;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0 != &local_120) {
            operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
          }
        }
        ppIVar37 = ppIVar37 + 1;
      } while (ppIVar37 != ppIVar41);
    }
    pCVar57 = pCVar40;
    if (pCVar40->consecutive_newline_count_ < 2) {
      WriteData(pCVar40,"\n",1);
      pCVar40->consecutive_newline_count_ = pCVar40->consecutive_newline_count_ + 1;
    }
    pCVar40->should_write_indent_next_ = true;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffed0,"w2c_",&pCVar40->module_prefix_);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[16],std::__cxx11::string,char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)pCVar40,(char (*) [16])&stack0xfffffffffffffed0,u_03,(char (*) [2])paVar32
               ,(OpenBrace *)in_R8);
    uVar27 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffed0 != &local_120) {
      operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
      uVar27 = extraout_RDX_02;
    }
    auVar56._8_8_ = uVar27;
    auVar56._0_8_ =
         (pCVar40->import_func_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pSVar1 = &pCVar40->import_func_module_set_;
    pCVar40 = pCVar57;
    while( true ) {
      pNVar31 = auVar56._8_8_;
      p_Var28 = auVar56._0_8_;
      if ((_Rb_tree_header *)p_Var28 == &(pSVar1->_M_t)._M_impl.super__Rb_tree_header) break;
      module_name_04._M_str = (char *)paVar32;
      module_name_04._M_len = *(size_t *)(p_Var28 + 1);
      (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                ((string *)&stack0xfffffffffffffed0,(CWriter *)p_Var28[1]._M_parent,module_name_04);
      WriteData(pCVar57,"struct ",7);
      WriteData(pCVar57,(char *)in_stack_fffffffffffffed0,local_128);
      WriteData(pCVar57,"* ",2);
      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)p_Var28[1]._M_parent;
      Write(pCVar57,(GlobalName *)0x2);
      (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)pCVar57,(char (*) [2])0x16ea3a,u_04);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffed0 != &local_120) {
        operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
      }
      auVar56 = std::_Rb_tree_increment(p_Var28);
    }
    ppIVar37 = (pCVar40->unique_imports_).
               super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar41 = (pCVar40->unique_imports_).
               super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar37 != ppIVar41) {
      pIVar11 = (Import *)(local_f0 + 0x10);
      do {
        pIVar12 = *ppIVar37;
        if ((pIVar12->kind_ & ~Last) != First) {
          str._M_str = (char *)paVar32;
          str._M_len = (size_t)(pIVar12->module_name)._M_dataplus._M_p;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    ((string *)&stack0xfffffffffffffed0,
                     (_anonymous_namespace_ *)(pIVar12->module_name)._M_string_length,str);
          str_00._M_str = (char *)paVar32;
          str_00._M_len = (size_t)(pIVar12->field_name)._M_dataplus._M_p;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    ((string *)local_f0,
                     (_anonymous_namespace_ *)(pIVar12->field_name)._M_string_length,str_00);
          pCVar57 = pCVar40;
          WriteData(pCVar40,"/* import: \'",0xc);
          WriteData(pCVar40,(char *)in_stack_fffffffffffffed0,local_128);
          WriteData(pCVar40,"\' \'",3);
          WriteData(pCVar40,(char *)local_f0._0_8_,local_f0._8_8_);
          WriteData(pCVar40,"\' */",4);
          if (pCVar40->consecutive_newline_count_ < 2) {
            WriteData(pCVar40,"\n",1);
            pCVar40->consecutive_newline_count_ = pCVar40->consecutive_newline_count_ + 1;
          }
          pCVar40->should_write_indent_next_ = true;
          if ((Import *)local_f0._0_8_ != pIVar11) {
            operator_delete((void *)local_f0._0_8_,CONCAT62(local_f0._18_6_,local_f0._16_2_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0 != &local_120) {
            operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
          }
          EVar5 = pIVar12->kind_;
          if (EVar5 == Table) {
            local_f0._16_2_ = 0x2a;
            local_f0._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            module_name_07._M_str = (char *)(pIVar12->field_name)._M_string_length;
            module_name_07._M_len = (size_t)(pIVar12->module_name)._M_dataplus._M_p;
            export_name_05._M_str = (char *)in_R9;
            export_name_05._M_len = (size_t)(pIVar12->field_name)._M_dataplus._M_p;
            local_f0._0_8_ = pIVar11;
            (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                      ((string *)&local_c8,(CWriter *)(pIVar12->module_name)._M_string_length,
                       module_name_07,export_name_05);
            pcVar42 = (char *)0xf;
            if ((Import *)local_f0._0_8_ != pIVar11) {
              pcVar42 = (char *)CONCAT62(local_f0._18_6_,local_f0._16_2_);
            }
            in_R8 = local_f0._8_8_;
            if (pcVar42 < (char *)(local_f0._8_8_ + local_c8._8_8_)) {
              in_R9 = &local_b8;
              uVar27 = (char *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_allocated_capacity != in_R9) {
                uVar27 = local_b8._M_allocated_capacity;
              }
              if ((ulong)uVar27 < (char *)(local_f0._8_8_ + local_c8._8_8_)) goto LAB_0013ca43;
              puVar29 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,local_f0._0_8_)
              ;
            }
            else {
LAB_0013ca43:
              puVar29 = (undefined8 *)
                        std::__cxx11::string::_M_append(local_f0,local_c8._M_allocated_capacity);
            }
            in_stack_fffffffffffffed0 = &local_120;
            paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar29 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 == paVar32) {
              local_120._M_allocated_capacity = paVar32->_M_allocated_capacity;
              local_120._8_8_ = puVar29[3];
            }
            else {
              local_120._M_allocated_capacity = paVar32->_M_allocated_capacity;
              in_stack_fffffffffffffed0 =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar29;
            }
            local_128 = puVar29[1];
            *puVar29 = paVar32;
            puVar29[1] = 0;
            paVar32->_M_local_buf[0] = '\0';
            WriteTable(pCVar57,(string *)&stack0xfffffffffffffed0,
                       (Type *)(ulong)*(uint *)&pIVar12[1].field_name.field_2);
            pNVar31 = extraout_RDX_04;
          }
          else if (EVar5 == Memory) {
            local_f0._16_2_ = 0x2a;
            local_f0._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            module_name_06._M_str = (char *)(pIVar12->field_name)._M_string_length;
            module_name_06._M_len = (size_t)(pIVar12->module_name)._M_dataplus._M_p;
            export_name_04._M_str = (char *)in_R9;
            export_name_04._M_len = (size_t)(pIVar12->field_name)._M_dataplus._M_p;
            local_f0._0_8_ = pIVar11;
            (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                      ((string *)&local_c8,(CWriter *)(pIVar12->module_name)._M_string_length,
                       module_name_06,export_name_04);
            pcVar42 = (char *)0xf;
            if ((Import *)local_f0._0_8_ != pIVar11) {
              pcVar42 = (char *)CONCAT62(local_f0._18_6_,local_f0._16_2_);
            }
            in_R8 = local_f0._8_8_;
            if (pcVar42 < (char *)(local_f0._8_8_ + local_c8._8_8_)) {
              in_R9 = &local_b8;
              uVar27 = (char *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_allocated_capacity != in_R9) {
                uVar27 = local_b8._M_allocated_capacity;
              }
              if ((ulong)uVar27 < (char *)(local_f0._8_8_ + local_c8._8_8_)) goto LAB_0013c9b6;
              puVar29 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,local_f0._0_8_)
              ;
            }
            else {
LAB_0013c9b6:
              puVar29 = (undefined8 *)
                        std::__cxx11::string::_M_append(local_f0,local_c8._M_allocated_capacity);
            }
            in_stack_fffffffffffffed0 = &local_120;
            paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar29 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 == paVar32) {
              local_120._M_allocated_capacity = paVar32->_M_allocated_capacity;
              local_120._8_8_ = puVar29[3];
            }
            else {
              local_120._M_allocated_capacity = paVar32->_M_allocated_capacity;
              in_stack_fffffffffffffed0 =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar29;
            }
            local_128 = puVar29[1];
            *puVar29 = paVar32;
            puVar29[1] = 0;
            paVar32->_M_local_buf[0] = '\0';
            if (pIVar12->kind_ != Memory) {
              pcVar42 = 
              "const Derived *wabt::cast(const Base *) [Derived = wabt::MemoryImport, Base = wabt::Import]"
              ;
              goto LAB_0013d8ba;
            }
            WriteMemory(pCVar57,(string *)&stack0xfffffffffffffed0,
                        (Memory *)
                        (ulong)*(byte *)((long)&pIVar12[1].field_name._M_string_length + 1));
            pNVar31 = extraout_RDX_03;
          }
          else {
            if (EVar5 != Global) {
LAB_0013d8a0:
              abort();
            }
            local_f0._16_2_ = 0x2a;
            local_f0._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            module_name_05._M_str = (char *)(pIVar12->field_name)._M_string_length;
            module_name_05._M_len = (size_t)(pIVar12->module_name)._M_dataplus._M_p;
            export_name_03._M_str = (char *)in_R9;
            export_name_03._M_len = (size_t)(pIVar12->field_name)._M_dataplus._M_p;
            local_f0._0_8_ = pIVar11;
            (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                      ((string *)&local_c8,(CWriter *)(pIVar12->module_name)._M_string_length,
                       module_name_05,export_name_03);
            pcVar42 = (char *)0xf;
            if ((Import *)local_f0._0_8_ != pIVar11) {
              pcVar42 = (char *)CONCAT62(local_f0._18_6_,local_f0._16_2_);
            }
            in_R8 = local_f0._8_8_;
            if (pcVar42 < (char *)(local_f0._8_8_ + local_c8._8_8_)) {
              in_R9 = &local_b8;
              uVar27 = (char *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_allocated_capacity != in_R9) {
                uVar27 = local_b8._M_allocated_capacity;
              }
              if ((ulong)uVar27 < (char *)(local_f0._8_8_ + local_c8._8_8_)) goto LAB_0013c929;
              puVar29 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,local_f0._0_8_)
              ;
            }
            else {
LAB_0013c929:
              puVar29 = (undefined8 *)
                        std::__cxx11::string::_M_append(local_f0,local_c8._M_allocated_capacity);
            }
            in_stack_fffffffffffffed0 = &local_120;
            paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar29 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar29 == paVar32) {
              local_120._M_allocated_capacity = paVar32->_M_allocated_capacity;
              local_120._8_8_ = puVar29[3];
            }
            else {
              local_120._M_allocated_capacity = paVar32->_M_allocated_capacity;
              in_stack_fffffffffffffed0 =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar29;
            }
            local_128 = puVar29[1];
            *puVar29 = paVar32;
            puVar29[1] = 0;
            paVar32->_M_local_buf[0] = '\0';
            WriteGlobal(pCVar57,*(Global **)((long)&pIVar12[1].module_name.field_2 + 8),
                        (string *)&stack0xfffffffffffffed0);
            pNVar31 = extraout_RDX_05;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0 != &local_120) {
            operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
            pNVar31 = extraout_RDX_06;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_allocated_capacity != &local_b8) {
            operator_delete((void *)local_c8._M_allocated_capacity,
                            (ulong)(local_b8._M_allocated_capacity + 1));
            pNVar31 = extraout_RDX_07;
          }
          if ((Import *)local_f0._0_8_ != pIVar11) {
            operator_delete((void *)local_f0._0_8_,CONCAT62(local_f0._18_6_,local_f0._16_2_) + 1);
            pNVar31 = extraout_RDX_08;
          }
          pCVar40 = pCVar57;
          if (pCVar57->consecutive_newline_count_ < 2) {
            WriteData(pCVar57,"\n",1);
            pCVar57->consecutive_newline_count_ = pCVar57->consecutive_newline_count_ + 1;
            pNVar31 = extraout_RDX_09;
          }
          pCVar57->should_write_indent_next_ = true;
        }
        ppIVar37 = ppIVar37 + 1;
      } while (ppIVar37 != ppIVar41);
    }
  }
  pMVar30 = pCVar40->module_;
  ppGVar35 = (pMVar30->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppGVar46 = (pMVar30->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  lVar43 = (long)ppGVar35 - (long)ppGVar46;
  pCVar57 = pCVar40;
  if ((lVar43 != 0) &&
     (pNVar31 = (Newline *)(ulong)pMVar30->num_global_imports, (Newline *)(lVar43 >> 3) != pNVar31))
  {
    uVar25 = 0;
    do {
      if (pCVar40->module_->num_global_imports <= uVar25) {
        pGVar13 = *ppGVar46;
        in_R8 = (pGVar13->name)._M_dataplus._M_p;
        name_00._M_str = (char *)in_R8;
        name_00._M_len = (pGVar13->name)._M_string_length;
        pCVar40 = pCVar57;
        (anonymous_namespace)::CWriter::DefineInstanceMemberName_abi_cxx11_
                  ((string *)&stack0xfffffffffffffed0,(CWriter *)pCVar57,Global,name_00);
        pCVar57 = pCVar40;
        WriteGlobal(pCVar40,(Global *)pGVar13->type,(string *)&stack0xfffffffffffffed0);
        pNVar31 = extraout_RDX_12;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0 != &local_120) {
          operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
          pNVar31 = extraout_RDX_13;
        }
        if (pCVar40->consecutive_newline_count_ < 2) {
          WriteData(pCVar40,"\n",1);
          pCVar40->consecutive_newline_count_ = pCVar40->consecutive_newline_count_ + 1;
          pNVar31 = extraout_RDX_14;
        }
        pCVar40->should_write_indent_next_ = true;
      }
      uVar25 = uVar25 + 1;
      ppGVar46 = ppGVar46 + 1;
    } while (ppGVar46 != ppGVar35);
    pMVar30 = pCVar40->module_;
  }
  ppMVar14 = (pMVar30->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppMVar47 = (pMVar30->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  lVar43 = (long)ppMVar14 - (long)ppMVar47;
  if ((lVar43 != 0) &&
     (pNVar31 = (Newline *)(ulong)pMVar30->num_memory_imports, (Newline *)(lVar43 >> 3) != pNVar31))
  {
    uVar25 = 0;
    do {
      if (pCVar40->module_->num_memory_imports <= uVar25) {
        pMVar15 = *ppMVar47;
        in_R8 = (pMVar15->name)._M_dataplus._M_p;
        name_01._M_str = (char *)in_R8;
        name_01._M_len = (pMVar15->name)._M_string_length;
        pCVar40 = pCVar57;
        (anonymous_namespace)::CWriter::DefineInstanceMemberName_abi_cxx11_
                  ((string *)&stack0xfffffffffffffed0,(CWriter *)pCVar57,Memory,name_01);
        pCVar57 = pCVar40;
        WriteMemory(pCVar40,(string *)&stack0xfffffffffffffed0,
                    (Memory *)(ulong)(pMVar15->page_limits).is_shared);
        pNVar31 = extraout_RDX_15;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0 != &local_120) {
          operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
          pNVar31 = extraout_RDX_16;
        }
        if (pCVar40->consecutive_newline_count_ < 2) {
          WriteData(pCVar40,"\n",1);
          pCVar40->consecutive_newline_count_ = pCVar40->consecutive_newline_count_ + 1;
          pNVar31 = extraout_RDX_17;
        }
        pCVar40->should_write_indent_next_ = true;
      }
      uVar25 = uVar25 + 1;
      ppMVar47 = ppMVar47 + 1;
    } while (ppMVar47 != ppMVar14);
    pMVar30 = pCVar40->module_;
  }
  ppTVar16 = (pMVar30->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppTVar48 = (pMVar30->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  lVar43 = (long)ppTVar16 - (long)ppTVar48;
  if ((lVar43 != 0) &&
     (pNVar31 = (Newline *)(ulong)pMVar30->num_table_imports, (Newline *)(lVar43 >> 3) != pNVar31))
  {
    uVar25 = 0;
    do {
      if (pCVar40->module_->num_table_imports <= uVar25) {
        pTVar17 = *ppTVar48;
        in_R8 = (pTVar17->name)._M_dataplus._M_p;
        name_02._M_str = (char *)in_R8;
        name_02._M_len = (pTVar17->name)._M_string_length;
        pCVar40 = pCVar57;
        (anonymous_namespace)::CWriter::DefineInstanceMemberName_abi_cxx11_
                  ((string *)&stack0xfffffffffffffed0,(CWriter *)pCVar57,Table,name_02);
        pCVar57 = pCVar40;
        WriteTable(pCVar40,(string *)&stack0xfffffffffffffed0,
                   (Type *)(ulong)(uint)(pTVar17->elem_type).enum_);
        pNVar31 = extraout_RDX_18;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0 != &local_120) {
          operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
          pNVar31 = extraout_RDX_19;
        }
        if (pCVar40->consecutive_newline_count_ < 2) {
          WriteData(pCVar40,"\n",1);
          pCVar40->consecutive_newline_count_ = pCVar40->consecutive_newline_count_ + 1;
          pNVar31 = extraout_RDX_20;
        }
        pCVar40->should_write_indent_next_ = true;
      }
      uVar25 = uVar25 + 1;
      ppTVar48 = ppTVar48 + 1;
    } while (ppTVar48 != ppTVar16);
    pMVar30 = pCVar40->module_;
  }
  ppDVar38 = (pMVar30->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppDVar18 = (pMVar30->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppDVar38 != ppDVar18) {
    pCVar40 = pCVar57;
    do {
      pDVar19 = *ppDVar38;
      in_R8 = (pDVar19->name)._M_dataplus._M_p;
      pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (pDVar19->name)._M_string_length;
      name_03._M_str = (char *)in_R8;
      name_03._M_len = (size_t)pbVar33;
      (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                ((string *)&stack0xfffffffffffffed0,(CWriter *)pCVar40,DataSegment,name_03);
      pNVar31 = extraout_RDX_21;
      if ((pDVar19->kind == Passive) &&
         ((pDVar19->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pDVar19->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[6],char_const(&)[22],std::__cxx11::string&,char_const(&)[6],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)pCVar40,(char (*) [6])0x16ef15,(char (*) [22])&stack0xfffffffffffffed0
                   ,pbVar33,(char (*) [6])in_R8,(Newline *)in_R9->_M_local_buf);
        pNVar31 = extraout_RDX_22;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffed0 != &local_120) {
        operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
        pNVar31 = extraout_RDX_23;
      }
      ppDVar38 = ppDVar38 + 1;
    } while (ppDVar38 != ppDVar18);
    pMVar30 = pCVar40->module_;
    pCVar57 = pCVar40;
  }
  ppEVar39 = (pMVar30->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppEVar20 = (pMVar30->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppEVar39 != ppEVar20) {
    pCVar40 = pCVar57;
    do {
      pEVar21 = *ppEVar39;
      in_R8 = (pEVar21->name)._M_dataplus._M_p;
      pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (pEVar21->name)._M_string_length;
      name_04._M_str = (char *)in_R8;
      name_04._M_len = (size_t)pbVar33;
      (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                ((string *)&stack0xfffffffffffffed0,(CWriter *)pCVar40,ElemSegment,name_04);
      pNVar31 = extraout_RDX_24;
      if ((pEVar21->kind == Passive) &&
         ((pEVar21->elem_exprs).
          super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pEVar21->elem_exprs).
          super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[6],char_const(&)[22],std::__cxx11::string&,char_const(&)[6],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)pCVar40,(char (*) [6])0x16f186,(char (*) [22])&stack0xfffffffffffffed0
                   ,pbVar33,(char (*) [6])in_R8,(Newline *)in_R9->_M_local_buf);
        pNVar31 = extraout_RDX_25;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffed0 != &local_120) {
        operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
        pNVar31 = extraout_RDX_26;
      }
      ppEVar39 = ppEVar39 + 1;
    } while (ppEVar39 != ppEVar20);
    pMVar30 = pCVar40->module_;
    pCVar57 = pCVar40;
  }
  if (((((pMVar30->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         (pMVar30->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
         _M_impl.super__Vector_impl_data._M_finish) &&
       ((pMVar30->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pMVar30->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
        _M_impl.super__Vector_impl_data._M_finish)) &&
      ((pMVar30->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (pMVar30->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     ((pCVar40->import_func_module_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    (anonymous_namespace)::CWriter::Write<char_const(&)[19],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)pCVar40,(char (*) [19])"char dummy_member;",pNVar31);
  }
  __rhs = &pCVar40->module_prefix_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffed0,"w2c_",__rhs);
  Write(pCVar40);
  WriteData(pCVar40," ",1);
  pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x16ea3a;
  (anonymous_namespace)::CWriter::
  Write<std::__cxx11::string,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)pCVar40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffed0,(char (*) [2])local_128,(Newline *)0x16ea3a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffed0 != &local_120) {
    operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
  }
  if (pCVar40->consecutive_newline_count_ < 2) {
    WriteData(pCVar40,"\n",1);
    pCVar40->consecutive_newline_count_ = pCVar40->consecutive_newline_count_ + 1;
  }
  pCVar40->should_write_indent_next_ = true;
  local_d0 = __rhs;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffed0,"w2c_",__rhs);
  WriteData(pCVar40,"void ",5);
  WriteData(pCVar40,"wasm2c_",7);
  WriteData(pCVar40,(pCVar40->module_prefix_)._M_dataplus._M_p,
            (pCVar40->module_prefix_)._M_string_length);
  WriteData(pCVar40,"_instantiate(",0xd);
  WriteData(pCVar40,(char *)in_stack_fffffffffffffed0,local_128);
  WriteData(pCVar40,"*",1);
  pNVar31 = extraout_RDX_27;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffed0 != &local_120) {
    operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
    pNVar31 = extraout_RDX_28;
  }
  p_Var28 = (pCVar57->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(pCVar57->import_module_set_)._M_t._M_impl.super__Rb_tree_header;
  pCVar40 = pCVar57;
  if ((_Rb_tree_header *)p_Var28 != p_Var3) {
    do {
      module_name_08._M_str = (char *)pbVar33;
      module_name_08._M_len = *(size_t *)(p_Var28 + 1);
      (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                ((string *)&stack0xfffffffffffffed0,(CWriter *)p_Var28[1]._M_parent,module_name_08);
      WriteData(pCVar57,", struct ",9);
      WriteData(pCVar57,(char *)in_stack_fffffffffffffed0,local_128);
      WriteData(pCVar57,"*",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffed0 != &local_120) {
        operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
      }
      auVar56 = std::_Rb_tree_increment(p_Var28);
      pNVar31 = auVar56._8_8_;
      p_Var28 = auVar56._0_8_;
    } while ((_Rb_tree_header *)p_Var28 != p_Var3);
  }
  pCVar57 = pCVar40;
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)pCVar40,(char (*) [3])0x16f8d8,pNVar31);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffed0,"w2c_",local_d0);
  WriteData(pCVar40,"void ",5);
  WriteData(pCVar40,"wasm2c_",7);
  WriteData(pCVar40,(pCVar40->module_prefix_)._M_dataplus._M_p,
            (pCVar40->module_prefix_)._M_string_length);
  WriteData(pCVar40,"_free(",6);
  WriteData(pCVar40,(char *)in_stack_fffffffffffffed0,local_128);
  WriteData(pCVar40,"*);",3);
  if (pCVar40->consecutive_newline_count_ < 2) {
    WriteData(pCVar40,"\n",1);
    pCVar40->consecutive_newline_count_ = pCVar40->consecutive_newline_count_ + 1;
  }
  pCVar40->should_write_indent_next_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffed0 != &local_120) {
    operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
  }
  WriteData(pCVar40,"wasm_rt_func_type_t ",0x14);
  WriteData(pCVar40,"wasm2c_",7);
  WriteData(pCVar40,(pCVar40->module_prefix_)._M_dataplus._M_p,
            (pCVar40->module_prefix_)._M_string_length);
  WriteData(pCVar40,"_get_func_type(uint32_t param_count, uint32_t result_count, ...);",0x41);
  if (pCVar40->consecutive_newline_count_ < 2) {
    WriteData(pCVar40,"\n",1);
    pCVar40->consecutive_newline_count_ = pCVar40->consecutive_newline_count_ + 1;
  }
  pCVar40->should_write_indent_next_ = true;
  ppTVar22 = (pCVar40->module_->types).
             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (ppTVar51 = (pCVar40->module_->types).
                  super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppTVar51 != ppTVar22; ppTVar51 = ppTVar51 + 1) {
    pTVar23 = *ppTVar51;
    if (pTVar23->kind_ != Func) {
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                    ,0x4e,
                    "Derived *wabt::cast(Base *) [Derived = wabt::FuncType, Base = wabt::TypeEntry]"
                   );
    }
    if ((*(long *)((long)&pTVar23[1].loc.field_1 + 8) - *(long *)&pTVar23[1].loc.field_1 &
        0x7fffffff0U) != 0) {
      DeclareStruct(pCVar57,(TypeVector *)&pTVar23[1].loc.field_1.field_0);
    }
  }
  ppIVar37 = (pCVar57->unique_imports_).
             super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppIVar41 = (pCVar57->unique_imports_).
             super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  pCVar40 = pCVar57;
  if (ppIVar37 != ppIVar41) {
    if (pCVar57->consecutive_newline_count_ < 2) {
      WriteData(pCVar57,"\n",1);
      pCVar57->consecutive_newline_count_ = pCVar57->consecutive_newline_count_ + 1;
      ppIVar37 = (pCVar57->unique_imports_).
                 super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppIVar41 = (pCVar57->unique_imports_).
                 super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    pCVar57->should_write_indent_next_ = true;
    if (ppIVar37 != ppIVar41) {
      do {
        pIVar11 = *ppIVar37;
        if (pIVar11->kind_ == Last) {
          str_03._M_str = (char *)pbVar33;
          str_03._M_len = (size_t)(pIVar11->module_name)._M_dataplus._M_p;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    ((string *)&stack0xfffffffffffffed0,
                     (_anonymous_namespace_ *)(pIVar11->module_name)._M_string_length,str_03);
          str_04._M_str = (char *)pbVar33;
          str_04._M_len = (size_t)(pIVar11->field_name)._M_dataplus._M_p;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    ((string *)local_a8,
                     (_anonymous_namespace_ *)(pIVar11->field_name)._M_string_length,str_04);
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::Newline,char_const(&)[13],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[5],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)pCVar40,(Newline *)&stack0xfffffffffffffed0,(char (*) [13])local_a8,
                     pbVar33,(char (*) [4])in_R8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R9,
                     (char (*) [5])pCVar40,(Newline *)in_stack_fffffffffffffed0);
          pCVar57 = pCVar40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._0_8_ != &local_98) {
            operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
            pCVar57 = pCVar40;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0 != &local_120) {
            operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
          }
          in_R8 = (pIVar11->field_name)._M_dataplus._M_p;
          pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (pIVar11->field_name)._M_string_length;
          module_name_11._M_str = (char *)pbVar33;
          module_name_11._M_len = (size_t)(pIVar11->module_name)._M_dataplus._M_p;
          export_name_07._M_str = (char *)in_R9;
          export_name_07._M_len = in_R8;
          (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                    ((string *)&stack0xfffffffffffffed0,
                     (CWriter *)(pIVar11->module_name)._M_string_length,module_name_11,
                     export_name_07);
          pCVar40 = pCVar57;
          WriteData(pCVar57,"extern const wasm_rt_tag_t ",0x1b);
          WriteData(pCVar57,(char *)in_stack_fffffffffffffed0,local_128);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)pCVar57,(char (*) [2])0x16ea3a,u_06);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0 != &local_120) {
            operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
          }
        }
        else if (pIVar11->kind_ == First) {
          str_01._M_str = (char *)pbVar33;
          str_01._M_len = (size_t)(pIVar11->module_name)._M_dataplus._M_p;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    ((string *)&stack0xfffffffffffffed0,
                     (_anonymous_namespace_ *)(pIVar11->module_name)._M_string_length,str_01);
          str_02._M_str = (char *)pbVar33;
          str_02._M_len = (size_t)(pIVar11->field_name)._M_dataplus._M_p;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    ((string *)local_a8,
                     (_anonymous_namespace_ *)(pIVar11->field_name)._M_string_length,str_02);
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::Newline,char_const(&)[13],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[5],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)pCVar40,(Newline *)&stack0xfffffffffffffed0,(char (*) [13])local_a8,
                     pbVar33,(char (*) [4])in_R8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R9,
                     (char (*) [5])pCVar40,(Newline *)in_stack_fffffffffffffed0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._0_8_ != &local_98) {
            operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0 != &local_120) {
            operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
          }
          if (pIVar11->kind_ != First) {
            pcVar42 = 
            "const Derived *wabt::cast(const Base *) [Derived = wabt::FuncImport, Base = wabt::Import]"
            ;
LAB_0013d8ba:
            __assert_fail("isa<Derived>(base)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                          ,0x48,pcVar42);
          }
          in_R8 = (pIVar11->field_name)._M_dataplus._M_p;
          pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (pIVar11->field_name)._M_string_length;
          module_name_09._M_str = (char *)pbVar33;
          module_name_09._M_len = (size_t)(pIVar11->module_name)._M_dataplus._M_p;
          export_name_06._M_str = (char *)in_R9;
          export_name_06._M_len = in_R8;
          (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                    ((string *)local_a8,(CWriter *)(pIVar11->module_name)._M_string_length,
                     module_name_09,export_name_06);
          pCVar57 = pCVar40;
          (anonymous_namespace)::CWriter::
          Write<std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
                    ((CWriter *)pCVar40,
                     (vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                     &pIVar11[2].field_name.field_2,(char (*) [2])local_a8,pbVar33,
                     (char (*) [2])in_R8);
          module_name_10._M_str = (char *)pbVar33;
          module_name_10._M_len = (size_t)(pIVar11->module_name)._M_dataplus._M_p;
          (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                    ((string *)&stack0xfffffffffffffed0,
                     (CWriter *)(pIVar11->module_name)._M_string_length,module_name_10);
          WriteData(pCVar40,"struct ",7);
          WriteData(pCVar40,(char *)in_stack_fffffffffffffed0,local_128);
          WriteData(pCVar40,"*",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0 != &local_120) {
            operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1);
          }
          pCVar58 = pCVar57;
          WriteParamTypes(pCVar57,(FuncDeclaration *)((long)&pIVar11[1].module_name.field_2 + 8));
          WriteData(pCVar57,")",1);
          pNVar31 = extraout_RDX_29;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._0_8_ != &local_98) {
            operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
            pNVar31 = extraout_RDX_30;
          }
          pCVar40 = pCVar58;
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)pCVar58,(char (*) [2])0x16ea3a,pNVar31);
          if ((pCVar58->options_->features).tail_call_enabled_ == true) {
            pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      pIVar11[1].module_name._M_dataplus._M_p;
            pCVar57 = pCVar40;
            GetTailCallRef((string *)&stack0xfffffffffffffed0,pCVar40,
                           (string *)pIVar11[1]._vptr_Import);
            WriteTailCallFuncDeclaration(pCVar40,(string *)&stack0xfffffffffffffed0);
            pNVar31 = extraout_RDX_31;
            pCVar40 = pCVar57;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)in_stack_fffffffffffffed0 != &local_120) {
              operator_delete((void *)in_stack_fffffffffffffed0,local_120._M_allocated_capacity + 1)
              ;
              pNVar31 = extraout_RDX_32;
              pCVar40 = pCVar57;
            }
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)pCVar40,(char (*) [2])0x16ea3a,pNVar31);
          }
        }
        ppIVar37 = ppIVar37 + 1;
      } while (ppIVar37 != ppIVar41);
    }
  }
  WriteImportProperties(pCVar40,Declarations);
  WriteExports(pCVar40,Declarations);
  if ((pCVar40->options_->features).tail_call_enabled_ == true) {
    WriteTailCallExports(pCVar40,Declarations);
  }
  if (pCVar40->consecutive_newline_count_ < 2) {
    WriteData(pCVar40,"\n",1);
    pCVar40->consecutive_newline_count_ = pCVar40->consecutive_newline_count_ + 1;
  }
  pCVar40->should_write_indent_next_ = true;
  pcVar42 = s_header_bottom;
  sVar26 = strlen(s_header_bottom);
  WriteData(pCVar40,pcVar42,sVar26);
  if (pCVar40->consecutive_newline_count_ < 2) {
    WriteData(pCVar40,"\n",1);
    pCVar40->consecutive_newline_count_ = pCVar40->consecutive_newline_count_ + 1;
  }
  pCVar40->should_write_indent_next_ = true;
  WriteData(pCVar40,"#endif  /* ",0xb);
  WriteData(pCVar40,local_50._M_dataplus._M_p,local_50._M_string_length);
  WriteData(pCVar40," */",3);
  if (pCVar40->consecutive_newline_count_ < 2) {
    WriteData(pCVar40,"\n",1);
    pCVar40->consecutive_newline_count_ = pCVar40->consecutive_newline_count_ + 1;
  }
  pCVar40->should_write_indent_next_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void CWriter::WriteCHeader() {
  ReserveExportNames();

  stream_ = h_stream_;
  std::string guard = GenerateHeaderGuard();
  Write("/* Automatically generated by wasm2c */", Newline());
  Write("#ifndef ", guard, Newline());
  Write("#define ", guard, Newline());
  Write(Newline());
  ComputeSimdScope();
  WriteHeaderIncludes();
  Write(s_header_top);
  Write(Newline());
  WriteModuleInstance();
  WriteInitDecl();
  WriteFreeDecl();
  WriteGetFuncTypeDecl();
  WriteMultivalueResultTypes();
  WriteImports();
  WriteImportProperties(CWriterPhase::Declarations);
  WriteExports(CWriterPhase::Declarations);
  if (options_.features.tail_call_enabled()) {
    WriteTailCallExports(CWriterPhase::Declarations);
  }
  Write(Newline());
  Write(s_header_bottom);
  Write(Newline(), "#endif  /* ", guard, " */", Newline());
}